

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

CSVError * __thiscall
duckdb::CSVError::InvalidState
          (CSVError *__return_storage_ptr__,CSVError *this,CSVReaderOptions *options,
          idx_t current_column,LinesPerBoundary error_info,string *csv_row,idx_t row_byte_position,
          optional_idx byte_position,string *current_path)

{
  LinesPerBoundary error_info_p;
  ostream *poVar1;
  string local_380;
  string local_360;
  string local_340;
  ostringstream how_to_fix_it;
  ostringstream error;
  
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&error);
  ::std::operator<<((ostream *)&error,
                    "The CSV Parser state machine reached an invalid state.\nThis can happen when is not possible to parse your CSV File with the given options, or the CSV File is not RFC 4180 compliant "
                   );
  ::std::__cxx11::ostringstream::ostringstream((ostringstream *)&how_to_fix_it);
  if ((this->full_error_message).field_2._M_local_buf[1] == '\x01') {
    poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,"Possible fixes:");
    ::std::operator<<(poVar1,'\n');
    poVar1 = ::std::operator<<((ostream *)&how_to_fix_it,
                               "* Disable the parser\'s strict mode (strict_mode=false) to allow reading rows that do not comply with the CSV standard."
                              );
    ::std::operator<<(poVar1,'\n');
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::string::string((string *)&local_380,(string *)error_info.lines_in_batch);
  ::std::__cxx11::stringbuf::str();
  error_info_p.lines_in_batch = error_info.boundary_idx;
  error_info_p.boundary_idx = current_column;
  CSVError(__return_storage_ptr__,&local_360,INVALID_STATE,(idx_t)options,&local_380,error_info_p,
           (idx_t)csv_row,(optional_idx)row_byte_position,(CSVReaderOptions *)this,&local_340,
           (string *)byte_position.index);
  ::std::__cxx11::string::~string((string *)&local_340);
  ::std::__cxx11::string::~string((string *)&local_380);
  ::std::__cxx11::string::~string((string *)&local_360);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&how_to_fix_it);
  ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error);
  return __return_storage_ptr__;
}

Assistant:

CSVError CSVError::InvalidState(const CSVReaderOptions &options, idx_t current_column, LinesPerBoundary error_info,
                                string &csv_row, idx_t row_byte_position, optional_idx byte_position,
                                const string &current_path) {
	std::ostringstream error;
	error << "The CSV Parser state machine reached an invalid state.\nThis can happen when is not possible to parse "
	         "your CSV File with the given options, or the CSV File is not RFC 4180 compliant ";
	std::ostringstream how_to_fix_it;
	if (options.dialect_options.state_machine_options.strict_mode.GetValue()) {
		how_to_fix_it << "Possible fixes:" << '\n';
		how_to_fix_it << "* Disable the parser's strict mode (strict_mode=false) to allow reading rows that do not "
		                 "comply with the CSV standard."
		              << '\n';
	}
	return CSVError(error.str(), INVALID_STATE, current_column, csv_row, error_info, row_byte_position, byte_position,
	                options, how_to_fix_it.str(), current_path);
}